

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

void fs_init(LexState *ls,FuncState *fs)

{
  lua_State *L;
  TValue *pTVar1;
  GCtab *pGVar2;
  
  L = ls->L;
  fs->prev = ls->fs;
  ls->fs = fs;
  fs->ls = ls;
  fs->vbase = ls->vtop;
  fs->L = L;
  fs->pc = 0;
  fs->lasttarget = 0;
  fs->jpc = 0xffffffff;
  fs->bl = (FuncScope *)0x0;
  fs->flags = '\0';
  fs->freereg = 0;
  fs->nactvar = 0;
  fs->nkn = 0;
  fs->nkgc = 0;
  fs->framesize = '\x01';
  fs->nuv = '\0';
  pGVar2 = lj_tab_new(L,0,0);
  fs->kt = pGVar2;
  L->top->u64 = (ulong)pGVar2 | 0xfffa000000000000;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  if (pTVar1 + 1 < (TValue *)(L->maxstack).ptr64) {
    return;
  }
  lj_state_growstack1(L);
  return;
}

Assistant:

static void fs_init(LexState *ls, FuncState *fs)
{
  lua_State *L = ls->L;
  fs->prev = ls->fs; ls->fs = fs;  /* Append to list. */
  fs->ls = ls;
  fs->vbase = ls->vtop;
  fs->L = L;
  fs->pc = 0;
  fs->lasttarget = 0;
  fs->jpc = NO_JMP;
  fs->freereg = 0;
  fs->nkgc = 0;
  fs->nkn = 0;
  fs->nactvar = 0;
  fs->nuv = 0;
  fs->bl = NULL;
  fs->flags = 0;
  fs->framesize = 1;  /* Minimum frame size. */
  fs->kt = lj_tab_new(L, 0, 0);
  /* Anchor table of constants in stack to avoid being collected. */
  settabV(L, L->top, fs->kt);
  incr_top(L);
}